

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

string * __thiscall test_upscale::vars_abi_cxx11_(string *__return_storage_ptr__,test_upscale *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  char *__s;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  long *local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  long *local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined8 uStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  __s = (char *)ggml_type_name(this->type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,__s,(allocator<char> *)&local_250);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x158cd9);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_e0 = *plVar5;
    lStack_d8 = plVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_200 = *puVar6;
    lStack_1f8 = plVar3[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar6;
    local_210 = (ulong *)*plVar3;
  }
  local_208 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  var_to_str<long,4ul>(&local_70,&this->ne);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x158d4f);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_240 = *puVar6;
    lStack_238 = plVar3[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar6;
    local_250 = (ulong *)*plVar3;
  }
  local_248 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar7 = 0xf;
  if (local_210 != &local_200) {
    uVar7 = local_200;
  }
  if (uVar7 < (ulong)(local_248 + local_208)) {
    uVar7 = 0xf;
    if (local_250 != &local_240) {
      uVar7 = local_240;
    }
    if (uVar7 < (ulong)(local_248 + local_208)) goto LAB_0013f6d9;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_210);
  }
  else {
LAB_0013f6d9:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_250);
  }
  local_1d0 = &local_1c0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_1c0 = *plVar3;
    uStack_1b8 = puVar4[3];
  }
  else {
    local_1c0 = *plVar3;
    local_1d0 = (long *)*puVar4;
  }
  local_1c8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_1e0 = *puVar6;
    lStack_1d8 = plVar3[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar6;
    local_1f0 = (ulong *)*plVar3;
  }
  local_1e8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  var_to_str<int>(&local_90,(int *)(ulong)(uint)this->scale_factor);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x159049);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_220 = *puVar6;
    lStack_218 = plVar3[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar6;
    local_230 = (ulong *)*plVar3;
  }
  local_228 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar7 = 0xf;
  if (local_1f0 != &local_1e0) {
    uVar7 = local_1e0;
  }
  if (uVar7 < (ulong)(local_228 + local_1e8)) {
    uVar7 = 0xf;
    if (local_230 != &local_220) {
      uVar7 = local_220;
    }
    if (uVar7 < (ulong)(local_228 + local_1e8)) goto LAB_0013f855;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_1f0);
  }
  else {
LAB_0013f855:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_230);
  }
  local_1b0 = &local_1a0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_1a0 = *plVar3;
    uStack_198 = puVar4[3];
  }
  else {
    local_1a0 = *plVar3;
    local_1b0 = (long *)*puVar4;
  }
  local_1a8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_120 = *puVar6;
    lStack_118 = plVar3[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar6;
    local_130 = (ulong *)*plVar3;
  }
  local_128 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  var_to_str_abi_cxx11_(&local_b0,this->mode);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x158ff0);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_140 = *puVar6;
    lStack_138 = plVar3[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar6;
    local_150 = (ulong *)*plVar3;
  }
  local_148 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar7 = 0xf;
  if (local_130 != &local_120) {
    uVar7 = local_120;
  }
  if (uVar7 < (ulong)(local_148 + local_128)) {
    uVar7 = 0xf;
    if (local_150 != &local_140) {
      uVar7 = local_140;
    }
    if (uVar7 < (ulong)(local_148 + local_128)) goto LAB_0013f9fe;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013f9fe:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_150);
  }
  local_190 = &local_180;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_180 = *plVar3;
    uStack_178 = puVar4[3];
  }
  else {
    local_180 = *plVar3;
    local_190 = (long *)*puVar4;
  }
  local_188 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_100 = *puVar6;
    lStack_f8 = plVar3[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar6;
    local_110 = (ulong *)*plVar3;
  }
  local_108 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  var_to_str<bool>(&local_d0,(bool *)(ulong)*(uint *)&this->transpose);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x159057);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_160 = *puVar6;
    lStack_158 = plVar3[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar6;
    local_170 = (ulong *)*plVar3;
  }
  local_168 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar7 = 0xf;
  if (local_110 != &local_100) {
    uVar7 = local_100;
  }
  if (uVar7 < (ulong)(local_168 + local_108)) {
    uVar7 = 0xf;
    if (local_170 != &local_160) {
      uVar7 = local_160;
    }
    if ((ulong)(local_168 + local_108) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_110);
      goto LAB_0013fbcd;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_170);
LAB_0013fbcd:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR5(type, ne, scale_factor, mode, transpose);
    }